

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

Aig_Man_t * Rtm_ManRetime(Aig_Man_t *p,int fForward,int nStepsMax,int fVerbose)

{
  Rtm_Obj_t *pObj;
  void *pvVar1;
  Rtm_Obj_t *pObj_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  Rtm_Man_t *p_00;
  uint *__ptr;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *p_01;
  size_t sVar7;
  char *pcVar8;
  Aig_Man_t *pAVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  timespec ts;
  timespec local_68;
  int local_54;
  uint local_50;
  int local_4c;
  Aig_Man_t *local_48;
  long local_40;
  long local_38;
  
  local_54 = fVerbose;
  local_4c = nStepsMax;
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  p_00 = Rtm_ManFromAig(p);
  uVar16 = p->nObjs[2] - p->nRegs;
  pVVar6 = p->vCis;
  local_48 = p;
  if ((int)uVar16 < pVVar6->nSize) {
    uVar18 = (ulong)uVar16;
    do {
      if ((int)uVar16 < 0) goto LAB_0060edb3;
      Rtm_ObjAddFirst(p_00,(Rtm_Edg_t *)(*(long *)((long)pVVar6->pArray[uVar18] + 0x28) + 0x20),
                      (uint)(fForward == 0) * 2 + RTM_VAL_ZERO);
      uVar18 = uVar18 + 1;
      pVVar6 = local_48->vCis;
    } while ((int)uVar18 < pVVar6->nSize);
  }
  if (fForward == 0) {
    uVar16 = Rtm_ManMarkAutoBwd(p_00);
  }
  else {
    uVar16 = Rtm_ManMarkAutoFwd(p_00);
  }
  pAVar9 = local_48;
  if (local_54 != 0) {
    iVar2 = 0x912e71;
    printf("Detected %d autonomous objects. ",(ulong)uVar16);
    Abc_Print(iVar2,"%s =","Time");
    iVar4 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
  }
  pVVar6 = p_00->vObjs;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      pvVar5 = pVVar6->pArray[lVar12];
      uVar16 = *(uint *)((long)pvVar5 + 8);
      if ((uVar16 >> 7 & 0xff) != uVar16 >> 0xf) {
        __assert_fail("pObj->nFanins == pObj->Num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x360,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
      }
      if (*(int *)((long)pvVar5 + 0x14) != *(int *)((long)pvVar5 + 0x10)) {
        __assert_fail("pObj->nFanouts == pObj->Temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x361,"Aig_Man_t *Rtm_ManRetime(Aig_Man_t *, int, int, int)");
      }
      *(uint *)((long)pvVar5 + 8) = uVar16 & 0x7fff;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar6->nSize);
  }
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    local_40 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    local_40 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar5 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar5;
  if (fForward == 0) {
    uVar16 = pAVar9->nObjs[3] - pAVar9->nRegs;
    pVVar6 = pAVar9->vCos;
    if ((int)uVar16 < pVVar6->nSize) {
      uVar18 = (ulong)uVar16;
      do {
        if ((int)uVar16 < 0) goto LAB_0060edb3;
        lVar12 = *(long *)((long)pVVar6->pArray[uVar18] + 0x28);
        if ((*(uint *)(lVar12 + 8) & 0x10) == 0) {
          *(uint *)(lVar12 + 8) = *(uint *)(lVar12 + 8) | 8;
          uVar14 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar14 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar11 = 0x10;
            }
            else {
              uVar11 = uVar3 * 2;
              if ((int)uVar11 <= (int)uVar3) goto LAB_0060e812;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar11;
          }
LAB_0060e812:
          __ptr[1] = uVar14 + 1;
          *(long *)(*(long *)(__ptr + 2) + (long)(int)uVar14 * 8) = lVar12;
        }
        uVar18 = uVar18 + 1;
        pVVar6 = pAVar9->vCos;
      } while ((int)uVar18 < pVVar6->nSize);
    }
  }
  else {
    uVar16 = pAVar9->nObjs[2] - pAVar9->nRegs;
    pVVar6 = pAVar9->vCis;
    if ((int)uVar16 < pVVar6->nSize) {
      uVar18 = (ulong)uVar16;
      do {
        if ((int)uVar16 < 0) {
LAB_0060edb3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar12 = *(long *)((long)pVVar6->pArray[uVar18] + 0x28);
        if ((*(uint *)(lVar12 + 8) & 0x10) == 0) {
          *(uint *)(lVar12 + 8) = *(uint *)(lVar12 + 8) | 8;
          uVar14 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar14 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(0x80);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar11 = 0x10;
            }
            else {
              uVar11 = uVar3 * 2;
              if ((int)uVar11 <= (int)uVar3) goto LAB_0060e72d;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar11;
          }
LAB_0060e72d:
          __ptr[1] = uVar14 + 1;
          *(long *)(*(long *)(__ptr + 2) + (long)(int)uVar14 * 8) = lVar12;
        }
        uVar18 = uVar18 + 1;
        pVVar6 = pAVar9->vCis;
      } while ((int)uVar18 < pVVar6->nSize);
    }
  }
  uVar16 = __ptr[1];
  if ((int)uVar16 < 1) {
    uVar14 = 0;
  }
  else {
    pvVar5 = *(void **)(__ptr + 2);
    lVar12 = 0;
    uVar14 = 0;
    do {
      pObj = *(Rtm_Obj_t **)((long)pvVar5 + lVar12 * 8);
      *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xfffffff7;
      local_38 = lVar12;
      if (fForward == 0) {
        Rtm_ObjRetimeBwd(p_00,pObj);
        if ((*(ushort *)&pObj->field_0x8 & 0x7f80) != 0) {
          uVar18 = 0;
          do {
            pObj_00 = (Rtm_Obj_t *)(&pObj[1].pCopy)[uVar18 * 2];
            uVar3 = *(uint *)&pObj_00->field_0x8;
            if (((uVar3 & 0x7f80) != 0 && (char)((uVar3 & 8) >> 3) == '\0') &&
               (local_50 = uVar14, iVar2 = Rtm_ObjCheckRetimeBwd(pObj_00), uVar14 = local_50,
               iVar2 != 0)) {
              if ((long)pObj_00->nFanouts < 1) {
                uVar11 = 1;
              }
              else {
                lVar12 = 0;
                uVar11 = 0;
                do {
                  uVar15 = *(uint *)(*(long *)((long)&pObj_00[1].pCopy +
                                              lVar12 + (ulong)(uVar3 >> 3 & 0xff0)) + 8) >> 0xf;
                  if (uVar15 < uVar11) {
                    uVar15 = uVar11;
                  }
                  uVar11 = uVar15;
                  lVar12 = lVar12 + 0x10;
                } while ((long)pObj_00->nFanouts * 0x10 != lVar12);
                uVar11 = uVar11 + 1;
              }
              if ((int)local_50 <= (int)uVar11) {
                uVar14 = uVar11;
              }
              if ((int)uVar11 <= local_4c) {
                *(uint *)&pObj_00->field_0x8 = uVar11 * 0x8000 + (uVar3 & 0x7ff7) + 8;
                uVar3 = *__ptr;
                if (uVar16 == uVar3) {
                  if ((int)uVar3 < 0x10) {
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc(0x80);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,0x80);
                    }
                    uVar11 = 0x10;
                  }
                  else {
                    uVar11 = uVar3 * 2;
                    if ((int)uVar11 <= (int)uVar3) goto LAB_0060eb06;
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc((ulong)uVar3 << 4);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,(ulong)uVar3 << 4);
                    }
                  }
                  *__ptr = uVar11;
                }
LAB_0060eb06:
                lVar12 = (long)(int)uVar16;
                uVar16 = uVar16 + 1;
                *(Rtm_Obj_t **)((long)pvVar5 + lVar12 * 8) = pObj_00;
              }
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 < (*(uint *)&pObj->field_0x8 >> 7 & 0xff));
        }
      }
      else {
        Rtm_ObjRetimeFwd(p_00,pObj);
        if (0 < pObj->nFanouts) {
          iVar2 = 0;
          do {
            pvVar1 = (&pObj[1].pCopy)[((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar2) * 2];
            uVar3 = *(uint *)((long)pvVar1 + 8);
            if ((uVar3 & 0xf) == 0) {
              uVar15 = uVar3 >> 7 & 0xff;
              uVar11 = 1;
              if (uVar15 != 0) {
                uVar18 = 0;
                do {
                  if ((*(ushort *)((long)pvVar1 + uVar18 + 0x20) & 0xfff) == 0) goto LAB_0060e8b0;
                  uVar18 = uVar18 + 0x10;
                } while (uVar15 << 4 != uVar18);
                if (uVar15 != 0) {
                  uVar18 = 0;
                  uVar11 = 0;
                  do {
                    uVar10 = *(uint *)(*(long *)((long)pvVar1 + uVar18 + 0x18) + 8) >> 0xf;
                    if (uVar10 < uVar11) {
                      uVar10 = uVar11;
                    }
                    uVar11 = uVar10;
                    uVar18 = uVar18 + 0x10;
                  } while (uVar15 << 4 != uVar18);
                  uVar11 = uVar11 + 1;
                }
              }
              if ((int)uVar14 <= (int)uVar11) {
                uVar14 = uVar11;
              }
              if ((int)uVar11 <= local_4c) {
                *(uint *)((long)pvVar1 + 8) = (uVar3 & 0x7ff0) + uVar11 * 0x8000 + 8;
                uVar3 = *__ptr;
                if (uVar16 == uVar3) {
                  if ((int)uVar3 < 0x10) {
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc(0x80);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,0x80);
                    }
                    uVar11 = 0x10;
                  }
                  else {
                    uVar11 = uVar3 * 2;
                    if ((int)uVar11 <= (int)uVar3) goto LAB_0060e99f;
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc((ulong)uVar3 << 4);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,(ulong)uVar3 << 4);
                    }
                  }
                  *__ptr = uVar11;
                }
LAB_0060e99f:
                lVar12 = (long)(int)uVar16;
                uVar16 = uVar16 + 1;
                *(void **)((long)pvVar5 + lVar12 * 8) = pvVar1;
              }
            }
LAB_0060e8b0:
            iVar2 = iVar2 + 1;
          } while (iVar2 < pObj->nFanouts);
        }
      }
      lVar12 = local_38 + 1;
    } while (lVar12 < (int)uVar16);
    *(void **)(__ptr + 2) = pvVar5;
  }
  __ptr[1] = uVar16;
  if (local_54 != 0) {
    pcVar17 = "fwd";
    if (fForward == 0) {
      pcVar17 = "bwd";
    }
    uVar3 = Rtm_ManLatchMax(p_00);
    printf("Performed %d %s latch moves of max depth %d and max latch count %d.\n",(ulong)uVar16,
           pcVar17,(ulong)uVar14,(ulong)uVar3);
    iVar2 = 0x912f48;
    printf("Memory usage = %d.  ",(ulong)(uint)p_00->nExtraCur);
    Abc_Print(iVar2,"%s =","Time");
    iVar4 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar12 + local_40) / 1000000.0);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  p_01 = Rtm_ManToAig(p_00);
  pAVar9 = local_48;
  pcVar17 = local_48->pName;
  if (pcVar17 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar17);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar17);
  }
  p_01->pName = pcVar8;
  pcVar17 = pAVar9->pSpec;
  if (pcVar17 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar17);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar17);
  }
  p_01->pSpec = pcVar8;
  Rtm_ManFree(p_00);
  iVar4 = clock_gettime(3,&local_68);
  iVar2 = local_54;
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  pAVar9 = Aig_ManReduceLaches(p_01,local_54);
  if (iVar2 != 0) {
    Abc_Print((int)p_01,"%s =","Register sharing time");
    iVar4 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
  }
  return pAVar9;
}

Assistant:

Aig_Man_t * Rtm_ManRetime( Aig_Man_t * p, int fForward, int nStepsMax, int fVerbose )
{
    Vec_Ptr_t * vQueue;
    Aig_Man_t * pNew;
    Rtm_Man_t * pRtm;
    Rtm_Obj_t * pObj, * pNext;
    Aig_Obj_t * pObjAig;
    int i, k, nAutos, Degree, DegreeMax = 0; 
    abctime clk;

    // create the retiming manager
clk = Abc_Clock();
    pRtm = Rtm_ManFromAig( p );
    // set registers
    Aig_ManForEachLoSeq( p, pObjAig, i )
        Rtm_ObjAddFirst( pRtm, Rtm_ObjEdge((Rtm_Obj_t *)pObjAig->pData, 0), fForward? RTM_VAL_ZERO : RTM_VAL_VOID );
    // detect and mark the autonomous components
    if ( fForward )
        nAutos = Rtm_ManMarkAutoFwd( pRtm );
    else
        nAutos = Rtm_ManMarkAutoBwd( pRtm );
    if ( fVerbose )
    {
        printf( "Detected %d autonomous objects. ", nAutos );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // set the current retiming number
    Rtm_ManForEachObj( pRtm, pObj, i )
    {
        assert( pObj->nFanins == pObj->Num );
        assert( pObj->nFanouts == pObj->Temp );
        pObj->Num = 0;
    }

clk = Abc_Clock();
    // put the LOs on the queue
    vQueue = Vec_PtrAlloc( 1000 );
    if ( fForward )
    {
        Aig_ManForEachLoSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    else
    {
        Aig_ManForEachLiSeq( p, pObjAig, i )
        {
            pObj = (Rtm_Obj_t *)pObjAig->pData;
            if ( pObj->fAuto )
                continue;
            pObj->fMark = 1;
            Vec_PtrPush( vQueue, pObj );
        }
    }
    // perform retiming 
    DegreeMax = 0;
    Vec_PtrForEachEntry( Rtm_Obj_t *, vQueue, pObj, i )
    {
        pObj->fMark = 0;
        // retime the node 
        if ( fForward )
        {
            Rtm_ObjRetimeFwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanout( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->Type ) // skip POs
                    continue;
                if ( !Rtm_ObjCheckRetimeFwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeFwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
        else
        {
            Rtm_ObjRetimeBwd( pRtm, pObj );
            // check if its fanouts should be retimed
            Rtm_ObjForEachFanin( pObj, pNext, k )
            {
                if ( pNext->fMark ) // skip aleady scheduled
                    continue;
                if ( pNext->nFanins == 0 ) // skip PIs
                    continue;
                if ( !Rtm_ObjCheckRetimeBwd( pNext ) ) // skip non-retimable
                    continue;
                Degree = Rtm_ObjGetDegreeBwd( pNext );
                DegreeMax = Abc_MaxInt( DegreeMax, Degree );
                if ( Degree > nStepsMax ) // skip nodes with high degree
                    continue;
                pNext->fMark = 1;
                pNext->Num = Degree;
                Vec_PtrPush( vQueue, pNext );
            }
        }
    }

    if ( fVerbose )
    {
        printf( "Performed %d %s latch moves of max depth %d and max latch count %d.\n", 
            Vec_PtrSize(vQueue), fForward? "fwd":"bwd", DegreeMax, Rtm_ManLatchMax(pRtm) );
        printf( "Memory usage = %d.  ", pRtm->nExtraCur );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vQueue );

    // get the new manager
    pNew = Rtm_ManToAig( pRtm );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Rtm_ManFree( pRtm );
    // group the registers
clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}